

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O3

bool __thiscall
QParallelAnimationGroupPrivate::shouldAnimationStart
          (QParallelAnimationGroupPrivate *this,QAbstractAnimation *animation,bool startIfAtEnd)

{
  int iVar1;
  Data *this_00;
  int iVar2;
  parameter_type pVar3;
  Node<QAbstractAnimation_*,_int> *pNVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QAbstractAnimation *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QAbstractAnimation::totalDuration((QAbstractAnimation *)animation);
  if (iVar2 == -1) {
    this_00 = (this->uncontrolledFinishTime).d;
    bVar5 = true;
    local_30 = animation;
    if (this_00 != (Data *)0x0) {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QAbstractAnimation*,int>>::
               findNode<QAbstractAnimation*>
                         ((Data<QHashPrivate::Node<QAbstractAnimation*,int>> *)this_00,&local_30);
      if (pNVar4 != (Node<QAbstractAnimation_*,_int> *)0x0) {
        bVar5 = SUB41((uint)pNVar4->value >> 0x1f,0);
      }
    }
  }
  else if (startIfAtEnd) {
    bVar5 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime <=
            iVar2;
  }
  else {
    pVar3 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
            ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.direction)
    ;
    iVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
    if (pVar3 == Forward) {
      bVar5 = iVar1 < iVar2;
    }
    else {
      bVar5 = iVar1 <= iVar2 && iVar1 != 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QParallelAnimationGroupPrivate::shouldAnimationStart(QAbstractAnimation *animation, bool startIfAtEnd) const
{
    const int dura = animation->totalDuration();
    if (dura == -1)
        return !isUncontrolledAnimationFinished(animation);
    if (startIfAtEnd)
        return currentTime <= dura;
    if (direction == QAbstractAnimation::Forward)
        return currentTime < dura;
    else //direction == QAbstractAnimation::Backward
        return currentTime && currentTime <= dura;
}